

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int cfd::capi::SetLastError(void *handle,int error_code,char *message)

{
  CfdCapiManager::SetLastError((CfdCapiManager *)handle,handle,error_code,message);
  return 0;
}

Assistant:

int SetLastError(void* handle, int error_code, const char* message) {
  try {
    cfd::capi::capi_instance.SetLastError(handle, error_code, message);
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}